

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<std::__cxx11::string,unsigned_int,int,std::__cxx11::string>
                   (char *fmt,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   uint *args_1,int *args_2,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostream *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream *this;
  uint *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  format<std::__cxx11::string,unsigned_int,int,std::__cxx11::string>
            (in_R8,in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(int *)this,in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}